

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_lantern_handling.hpp
# Opt level: O3

uint32_t PatchImproveLanternHandling::inject_func_and_words(ROM *rom)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  AddressInRegister ret;
  Code func;
  allocator_type local_109;
  string local_108;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_e8;
  Code local_c8;
  DataRegister local_48;
  AddressRegister local_38;
  
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48.super_Register._code = '\x02';
  local_48.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  __l._M_len = 1;
  __l._M_array = &local_48;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_108,__l,
             &local_109);
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.super_Register._code = '\a';
  local_38.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  md::Code::movem(&local_c8,
                  (vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_108,
                  &local_e8,true,&local_38,LONG);
  if (local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) - (long)local_108._M_dataplus._M_p);
  }
  paVar1 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"loop","");
  md::Code::label(&local_c8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  local_108._M_dataplus._M_p = (pointer)&PTR_getXn_00262d18;
  local_108.field_2._M_local_buf[0] = '\0';
  local_108._M_string_length = (size_type)&PTR_getXn_00262c50;
  local_108.field_2._8_2_ = 0;
  local_108.field_2._M_local_buf[10] = '\x02';
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 2;
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262be0;
  md::Code::move(&local_c8,(Param *)&local_108,(Param *)&local_e8,WORD);
  local_108._M_string_length = local_108._M_string_length & 0xffffffffffffff00;
  local_108._M_dataplus._M_p = (pointer)&PTR_getXn_00262be0;
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 2;
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262be0;
  md::Code::and_to_dx(&local_c8,(Param *)&local_108,(DataRegister *)&local_e8,WORD);
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 2;
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262be0;
  local_108._M_dataplus._M_p = (pointer)&PTR_getXn_00262d18;
  local_108.field_2._M_local_buf[0] = '\0';
  local_108._M_string_length = (size_type)&PTR_getXn_00262c50;
  local_108.field_2._8_2_ = 0;
  local_108.field_2._M_local_buf[10] = '\x03';
  md::Code::move(&local_c8,(Param *)&local_e8,(Param *)&local_108,WORD);
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_e8.
                         super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,1);
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262be0;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"loop","");
  md::Code::dbra(&local_c8,(DataRegister *)&local_e8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  local_48.super_Register._code = '\x02';
  local_48.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  __l_00._M_len = 1;
  __l_00._M_array = &local_48;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_108,__l_00,
             &local_109);
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.super_Register._code = '\a';
  local_38.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  md::Code::movem(&local_c8,
                  (vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_108,
                  &local_e8,false,&local_38,LONG);
  if (local_e8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) - (long)local_108._M_dataplus._M_p);
  }
  md::Code::rts(&local_c8);
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
  uVar2 = md::ROM::inject_code(rom,&local_c8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_c8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c8._pending_branches._M_t);
  if (local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar2;
}

Assistant:

static uint32_t inject_func_and_words(md::ROM& rom)
    {
        md::Code func;
        func.movem_to_stack({ reg_D2 }, {});
        {
            func.label("loop");
            {
                func.movew(addr_(reg_A0), reg_D2);
                func.andw(reg_D0, reg_D2);
                func.movew(reg_D2, addr_postinc_(reg_A0));
            }
            func.dbra(reg_D1, "loop");
        }
        func.movem_from_stack({ reg_D2 }, {});
        func.rts();
        return rom.inject_code(func);
    }